

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O0

Node * __thiscall SplayTree::splay(SplayTree *this,int value,Node *root)

{
  Node *local_50;
  Node *RightTreeMin;
  Node *LeftTreeMax;
  Node header;
  Node *root_local;
  int value_local;
  SplayTree *this_local;
  
  if (root == (Node *)0x0) {
    this_local = (SplayTree *)0x0;
  }
  else {
    header.rightChild = root;
    memset(&LeftTreeMax,0,0x18);
    header.leftChild = (Node *)0x0;
    header.value = 0;
    header._4_4_ = 0;
    RightTreeMin = (Node *)&LeftTreeMax;
    local_50 = (Node *)&LeftTreeMax;
    while( true ) {
      while ((header.rightChild)->value <= value) {
        if (((value <= (header.rightChild)->value) ||
            ((header.rightChild)->rightChild == (Node *)0x0)) ||
           (((header.rightChild)->rightChild->value < value &&
            (header.rightChild = leftRotate(this,header.rightChild),
            (header.rightChild)->rightChild == (Node *)0x0)))) goto LAB_0010efb0;
        RightTreeMin->rightChild = header.rightChild;
        RightTreeMin = RightTreeMin->rightChild;
        header.rightChild = (header.rightChild)->rightChild;
        RightTreeMin->rightChild = (Node *)0x0;
      }
      if (((header.rightChild)->leftChild == (Node *)0x0) ||
         ((value < (header.rightChild)->leftChild->value &&
          (header.rightChild = rightRotate(this,header.rightChild),
          (header.rightChild)->leftChild == (Node *)0x0)))) break;
      local_50->leftChild = header.rightChild;
      local_50 = local_50->leftChild;
      header.rightChild = (header.rightChild)->leftChild;
      local_50->leftChild = (Node *)0x0;
    }
LAB_0010efb0:
    RightTreeMin->rightChild = (header.rightChild)->leftChild;
    local_50->leftChild = (header.rightChild)->rightChild;
    (header.rightChild)->leftChild = header.leftChild;
    (header.rightChild)->rightChild = (Node *)header._0_8_;
    this_local = (SplayTree *)header.rightChild;
  }
  return (Node *)this_local;
}

Assistant:

SplayTree::Node *SplayTree::splay(int value, Node *root) {
    if (!root) {
        return nullptr;
    }
    Node header{};
    /* header.rChild points to L tree; header.lChild points to R Tree */
    header.leftChild = header.rightChild = nullptr;
    Node *LeftTreeMax = &header;
    Node *RightTreeMin = &header;

    /* loop until root->lChild == NULL || root->rChild == NULL; then break!
       (or when find the key, break too.)
     The zig/zag mode would only happen when cannot find key and will reach
     null on one side after RR or LL Rotation.
     */
    while (true) {
        if (value < root->value) {
            if (!root->leftChild) {
                break;
            }
            if (value < root->leftChild->value) {
                root = rightRotate(root); /* only zig-zig mode need to rotate once,
										   because zig-zag mode is handled as zig
										   mode, which doesn't require rotate,
										   just linking it to R Tree */
                if (!root->leftChild) {
                    break;
                }
            }
            /* Link to R Tree */
            RightTreeMin->leftChild = root;
            RightTreeMin = RightTreeMin->leftChild;
            root = root->leftChild;
            RightTreeMin->leftChild = nullptr;
        } else if (value > root->value) {
            if (!root->rightChild) {
                break;
            }
            if (value > root->rightChild->value) {
                root = leftRotate(root);/* only zag-zag mode need to rotate once,
										  because zag-zig mode is handled as zag
										  mode, which doesn't require rotate,
										  just linking it to L Tree */
                if (!root->rightChild) {
                    break;
                }
            }
            /* Link to L Tree */
            LeftTreeMax->rightChild = root;
            LeftTreeMax = LeftTreeMax->rightChild;
            root = root->rightChild;
            LeftTreeMax->rightChild = nullptr;
        } else {
            break;
        }
    }
    /* assemble L Tree, Middle Tree and R tree together */
    LeftTreeMax->rightChild = root->leftChild;
    RightTreeMin->leftChild = root->rightChild;
    root->leftChild = header.rightChild;
    root->rightChild = header.leftChild;

    return root;
}